

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

void resampler_fill_and_remove_delay(resampler *r)

{
  float *__src;
  float *__dest;
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  float *pfVar4;
  undefined8 uVar5;
  byte bVar6;
  anon_struct_8_2_f9ee98fb_for_bigint_1 aVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float *in_;
  float *pfVar17;
  float *pfVar18;
  double *pdVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  int iVar26;
  unsigned_long_long uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  unsigned_long_long uVar33;
  int iVar34;
  float *out;
  uint uVar35;
  bool bVar36;
  float fVar37;
  double dVar38;
  double dVar39;
  float fVar40;
  double dVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  double dVar45;
  ulong local_1b0;
  undefined8 local_138;
  undefined8 uStack_130;
  float afStack_100 [48];
  double local_40 [2];
  
  iVar14 = resampler_has_sse;
  bVar6 = r->quality;
  iVar26 = 1;
  if ((byte)(bVar6 - 2) < 4) {
    iVar26 = *(int *)(&DAT_007791f0 + (ulong)(byte)(bVar6 - 2) * 4);
  }
  uVar35 = r->write_filled;
  if (iVar26 < (int)uVar35) {
    __src = r->buffer_out;
    __dest = r->buffer_out + 0x40;
    do {
      iVar34 = r->read_filled;
      if (0x3f < iVar34) break;
      iVar16 = r->read_pos;
      uVar30 = iVar16 + iVar34;
      uVar22 = iVar16 + 0x3f + iVar34;
      if (-1 < (int)uVar30) {
        uVar22 = uVar30;
      }
      iVar31 = uVar30 - (uVar22 & 0xffffffc0);
      pfVar25 = __src + iVar31;
      if (iVar34 <= iVar31) {
        iVar34 = iVar31;
      }
      if (bVar6 < 6) {
        iVar34 = 0x40 - iVar34;
        switch(bVar6) {
        case 0:
          if (1 < (int)uVar35) {
            pfVar23 = pfVar25 + iVar34;
            pfVar18 = (float *)((long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148);
            uVar28 = (r->phase).quad;
            uVar27 = (r->phase_inc).quad;
            pfVar17 = pfVar18;
            do {
              if (pfVar23 <= pfVar25) break;
              *pfVar25 = *pfVar17;
              pfVar25 = pfVar25 + 1;
              uVar28 = uVar28 + uVar27;
              pfVar17 = pfVar17 + (uVar28 >> 0x20);
              uVar28 = uVar28 & 0xffffffff;
            } while (pfVar17 < pfVar18 + ((ulong)uVar35 - 1));
            (r->phase).quad = uVar28;
LAB_006f5fe1:
            iVar34 = uVar35 - (int)((ulong)((long)pfVar17 - (long)pfVar18) >> 2);
LAB_006f6c0b:
            r->write_filled = iVar34;
          }
          break;
        case 1:
          iVar15 = 0x1f;
          if (iVar16 < 0x1f) {
            iVar15 = iVar16;
          }
          if (iVar31 < iVar16) {
            iVar15 = 0;
          }
          sVar3 = (long)iVar15 * 4;
          memcpy(__dest,__src,sVar3);
          pfVar18 = (float *)((long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148);
          pfVar17 = pfVar25 + (long)iVar34 + (long)iVar15;
          if (iVar14 == 0) {
            if (1 < (int)uVar35) {
              dVar39 = r->last_amp;
              uVar27 = (r->inv_phase).quad;
              uVar33 = (r->inv_phase_inc).quad;
              pfVar23 = pfVar18;
              do {
                pfVar24 = pfVar25 + 0x20;
                if (pfVar24 <= pfVar17) {
                  fVar37 = *pfVar23;
                  dVar41 = (double)fVar37 - dVar39;
                  if (dVar41 != 0.0) {
                    iVar15 = (int)(uVar27 >> 0x16);
                    iVar16 = iVar15 * 0x399;
                    iVar34 = iVar16 + 0x3ff;
                    if (-1 < iVar16) {
                      iVar34 = iVar16;
                    }
                    uVar22 = iVar15 - 0x4000;
                    uVar30 = (iVar34 >> 10) - 0x3990;
                    dVar45 = 0.0;
                    iVar34 = 0x11;
                    pdVar19 = local_40;
                    do {
                      uVar9 = -uVar30;
                      if (0 < (int)uVar30) {
                        uVar9 = uVar30;
                      }
                      uVar10 = -uVar22;
                      if (0 < (int)uVar22) {
                        uVar10 = uVar22;
                      }
                      fVar40 = window_lut[uVar10];
                      fVar42 = sinc_lut[uVar9];
                      *pdVar19 = (double)(fVar40 * fVar42);
                      dVar45 = dVar45 + (double)(fVar40 * fVar42);
                      iVar34 = iVar34 + -1;
                      pdVar19 = pdVar19 + -1;
                      uVar22 = uVar22 + 0x400;
                      uVar30 = uVar30 + 0x399;
                    } while (-0xf < iVar34);
                    lVar20 = 0;
                    do {
                      *(ulong *)(pfVar25 + lVar20) =
                           CONCAT44((float)((ulong)*(undefined8 *)(pfVar25 + lVar20) >> 0x20) +
                                    (float)((double)(&uStack_130)[lVar20] * dVar41 * (1.0 / dVar45))
                                    ,(float)*(undefined8 *)(pfVar25 + lVar20) +
                                     (float)((double)(&local_138)[lVar20] * dVar41 * (1.0 / dVar45))
                                   );
                      lVar20 = lVar20 + 2;
                      dVar39 = (double)fVar37;
                    } while (lVar20 != 0x20);
                  }
                  pfVar23 = pfVar23 + 1;
                  uVar28 = uVar27 + uVar33;
                  pfVar25 = pfVar25 + (uVar28 >> 0x20);
                  uVar27 = uVar28 & 0xffffffff;
                }
              } while ((pfVar24 <= pfVar17) && (pfVar23 < pfVar18 + ((ulong)uVar35 - 1)));
              (r->inv_phase).quad = uVar27;
              r->last_amp = dVar39;
              iVar34 = (int)((ulong)((long)pfVar23 - (long)pfVar18) >> 2);
              goto LAB_006f68cc;
            }
LAB_006f68e0:
            bVar36 = true;
          }
          else {
            if ((int)uVar35 < 2) goto LAB_006f68e0;
            dVar39 = r->last_amp;
            uVar27 = (r->inv_phase).quad;
            uVar33 = (r->inv_phase_inc).quad;
            pfVar23 = pfVar18;
            do {
              pfVar24 = pfVar25 + 0x20;
              if (pfVar24 <= pfVar17) {
                fVar37 = *pfVar23;
                dVar41 = (double)fVar37 - dVar39;
                if (dVar41 != 0.0) {
                  iVar15 = (int)(uVar27 >> 0x16);
                  iVar16 = iVar15 * 0x399;
                  iVar34 = iVar16 + 0x3ff;
                  if (-1 < iVar16) {
                    iVar34 = iVar16;
                  }
                  uVar30 = (iVar34 >> 10) - 0x3990;
                  uVar22 = iVar15 - 0x4000;
                  fVar40 = 0.0;
                  lVar20 = 0x11;
                  do {
                    uVar9 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar9 = uVar30;
                    }
                    uVar10 = -uVar22;
                    if (0 < (int)uVar22) {
                      uVar10 = uVar22;
                    }
                    fVar42 = window_lut[uVar10];
                    fVar43 = sinc_lut[uVar9];
                    afStack_100[lVar20] = fVar42 * fVar43;
                    fVar40 = fVar40 + fVar42 * fVar43;
                    lVar20 = lVar20 + -1;
                    uVar30 = uVar30 + 0x399;
                    uVar22 = uVar22 + 0x400;
                  } while (-0xf < lVar20);
                  fVar40 = (float)(dVar41 / (double)fVar40);
                  lVar20 = 0;
                  do {
                    fVar42 = *(float *)((long)&local_138 + lVar20 + 4);
                    fVar43 = *(float *)((long)&uStack_130 + lVar20);
                    fVar44 = *(float *)((long)&uStack_130 + lVar20 + 4);
                    pfVar4 = (float *)((long)pfVar25 + lVar20);
                    fVar11 = pfVar4[1];
                    fVar12 = pfVar4[2];
                    fVar13 = pfVar4[3];
                    pfVar1 = (float *)((long)pfVar25 + lVar20);
                    *pfVar1 = *pfVar4 + *(float *)((long)&local_138 + lVar20) * fVar40;
                    pfVar1[1] = fVar11 + fVar42 * fVar40;
                    pfVar1[2] = fVar12 + fVar43 * fVar40;
                    pfVar1[3] = fVar13 + fVar44 * fVar40;
                    lVar20 = lVar20 + 0x10;
                    dVar39 = (double)fVar37;
                  } while (lVar20 != 0x80);
                }
                pfVar23 = pfVar23 + 1;
                uVar28 = uVar27 + uVar33;
                pfVar25 = pfVar25 + (uVar28 >> 0x20);
                uVar27 = uVar28 & 0xffffffff;
              }
            } while ((pfVar24 <= pfVar17) && (pfVar23 < pfVar18 + ((ulong)uVar35 - 1)));
            (r->inv_phase).quad = uVar27;
            r->last_amp = dVar39;
            iVar34 = (int)((ulong)((long)pfVar23 - (long)pfVar18) >> 2);
            uVar35 = r->write_filled;
LAB_006f68cc:
            r->write_filled = uVar35 - iVar34;
            bVar36 = iVar34 == 0;
          }
          memcpy(__src,__dest,sVar3);
          if (bVar36) goto LAB_006f6c3f;
          break;
        case 2:
          if (2 < (int)uVar35) {
            pfVar23 = pfVar25 + iVar34;
            pfVar18 = (float *)((long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148);
            uVar22 = (r->phase).field_1.lo;
            uVar30 = (r->phase).field_1.hi;
            aVar7 = (r->phase_inc).field_1;
            pfVar17 = pfVar18;
            do {
              if (pfVar23 <= pfVar25) goto LAB_006f5fd7;
              *pfVar25 = (float)uVar22 * 2.3283064e-10 * (pfVar17[1] - *pfVar17) + *pfVar17;
              pfVar25 = pfVar25 + 1;
              lVar20 = (ulong)uVar22 + (long)aVar7;
              pfVar17 = pfVar17 + (uVar30 + (int)((ulong)lVar20 >> 0x20));
              uVar22 = uVar22 + aVar7.lo;
              uVar30 = 0;
            } while (pfVar17 < pfVar18 + ((ulong)uVar35 - 2));
            uVar22 = (uint)lVar20;
LAB_006f5fd7:
            (r->phase).field_1.lo = uVar22;
            (r->phase).field_1.hi = uVar30;
            goto LAB_006f5fe1;
          }
          break;
        case 3:
          iVar15 = 0x1f;
          if (iVar16 < 0x1f) {
            iVar15 = iVar16;
          }
          if (iVar31 < iVar16) {
            iVar15 = 0;
          }
          sVar3 = (long)iVar15 * 4;
          memcpy(__dest,__src,sVar3);
          pfVar23 = (float *)((long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148);
          pfVar17 = pfVar25 + (long)iVar34 + (long)iVar15;
          pfVar18 = pfVar25;
          if (iVar14 == 0) {
            if (2 < (int)uVar35) {
              dVar39 = r->last_amp;
              local_1b0 = (r->phase).quad;
              uVar28 = (r->phase_inc).quad;
              uVar27 = (r->inv_phase).quad;
              uVar8 = (r->inv_phase_inc).quad;
              pfVar24 = pfVar23;
              do {
                pfVar4 = pfVar18 + 0x20;
                if (pfVar4 <= pfVar17) {
                  dVar41 = (double)*pfVar24;
                  if (uVar28 >> 0x20 == 0) {
                    dVar41 = dVar41 + (double)((float)local_1b0 * 2.3283064e-10 *
                                              (pfVar24[1] - *pfVar24));
                  }
                  dVar45 = dVar41 - dVar39;
                  if (dVar45 != 0.0) {
                    iVar16 = (int)(uVar27 >> 0x16);
                    iVar15 = iVar16 * 0x3b8;
                    iVar34 = iVar15 + 0x3ff;
                    if (-1 < iVar15) {
                      iVar34 = iVar15;
                    }
                    uVar22 = iVar16 - 0x4000;
                    uVar30 = (iVar34 >> 10) - 0x3b80;
                    dVar38 = 0.0;
                    iVar34 = 0x11;
                    pdVar19 = local_40;
                    do {
                      uVar9 = -uVar30;
                      if (0 < (int)uVar30) {
                        uVar9 = uVar30;
                      }
                      uVar10 = -uVar22;
                      if (0 < (int)uVar22) {
                        uVar10 = uVar22;
                      }
                      fVar37 = window_lut[uVar10];
                      fVar40 = sinc_lut[uVar9];
                      *pdVar19 = (double)(fVar37 * fVar40);
                      dVar38 = dVar38 + (double)(fVar37 * fVar40);
                      iVar34 = iVar34 + -1;
                      pdVar19 = pdVar19 + -1;
                      uVar22 = uVar22 + 0x400;
                      uVar30 = uVar30 + 0x3b8;
                    } while (-0xf < iVar34);
                    lVar20 = 0;
                    do {
                      *(ulong *)(pfVar18 + lVar20) =
                           CONCAT44((float)((ulong)*(undefined8 *)(pfVar18 + lVar20) >> 0x20) +
                                    (float)((double)(&uStack_130)[lVar20] * dVar45 * (1.0 / dVar38))
                                    ,(float)*(undefined8 *)(pfVar18 + lVar20) +
                                     (float)((double)(&local_138)[lVar20] * dVar45 * (1.0 / dVar38))
                                   );
                      lVar20 = lVar20 + 2;
                      dVar39 = dVar41;
                    } while (lVar20 != 0x20);
                  }
                  if (uVar8 >> 0x20 == 0) {
                    pfVar24 = pfVar24 + 1;
                    uVar32 = uVar27 + uVar8;
                    pfVar18 = pfVar18 + (uVar32 >> 0x20);
                    uVar27 = uVar32 & 0xffffffff;
                  }
                  else {
                    uVar32 = local_1b0 + uVar28;
                    pfVar18 = pfVar18 + 1;
                    pfVar24 = pfVar24 + (uVar32 >> 0x20);
                    local_1b0 = uVar32 & 0xffffffff;
                  }
                }
              } while ((pfVar4 <= pfVar17) && (pfVar24 < pfVar23 + ((ulong)uVar35 - 2)));
              (r->phase).quad = local_1b0;
              (r->inv_phase).quad = uVar27;
              r->last_amp = dVar39;
              iVar34 = (int)((ulong)((long)pfVar24 - (long)pfVar23) >> 2);
              goto LAB_006f6728;
            }
          }
          else if (2 < (int)uVar35) {
            dVar39 = r->last_amp;
            uVar27 = (r->phase).quad;
            uVar28 = (r->phase_inc).quad;
            uVar33 = (r->inv_phase).quad;
            uVar8 = (r->inv_phase_inc).quad;
            pfVar24 = pfVar23;
            do {
              pfVar4 = pfVar18 + 0x20;
              if (pfVar4 <= pfVar17) {
                dVar41 = (double)*pfVar24;
                if (uVar28 >> 0x20 == 0) {
                  dVar41 = dVar41 + (double)((float)uVar27 * 2.3283064e-10 * (pfVar24[1] - *pfVar24)
                                            );
                }
                if (dVar41 - dVar39 != 0.0) {
                  iVar16 = (int)(uVar33 >> 0x16);
                  iVar15 = iVar16 * 0x3b8;
                  iVar34 = iVar15 + 0x3ff;
                  if (-1 < iVar15) {
                    iVar34 = iVar15;
                  }
                  uVar30 = (iVar34 >> 10) - 0x3b80;
                  uVar22 = iVar16 - 0x4000;
                  fVar37 = 0.0;
                  lVar20 = 0x11;
                  do {
                    uVar9 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar9 = uVar30;
                    }
                    uVar10 = -uVar22;
                    if (0 < (int)uVar22) {
                      uVar10 = uVar22;
                    }
                    fVar40 = window_lut[uVar10];
                    fVar42 = sinc_lut[uVar9];
                    afStack_100[lVar20] = fVar40 * fVar42;
                    fVar37 = fVar37 + fVar40 * fVar42;
                    lVar20 = lVar20 + -1;
                    uVar30 = uVar30 + 0x3b8;
                    uVar22 = uVar22 + 0x400;
                  } while (-0xf < lVar20);
                  fVar37 = (float)((dVar41 - dVar39) / (double)fVar37);
                  lVar20 = 0;
                  do {
                    fVar40 = *(float *)((long)&local_138 + lVar20 + 4);
                    fVar42 = *(float *)((long)&uStack_130 + lVar20);
                    fVar43 = *(float *)((long)&uStack_130 + lVar20 + 4);
                    pfVar1 = (float *)((long)pfVar18 + lVar20);
                    fVar44 = pfVar1[1];
                    fVar11 = pfVar1[2];
                    fVar12 = pfVar1[3];
                    pfVar2 = (float *)((long)pfVar18 + lVar20);
                    *pfVar2 = *pfVar1 + *(float *)((long)&local_138 + lVar20) * fVar37;
                    pfVar2[1] = fVar44 + fVar40 * fVar37;
                    pfVar2[2] = fVar11 + fVar42 * fVar37;
                    pfVar2[3] = fVar12 + fVar43 * fVar37;
                    lVar20 = lVar20 + 0x10;
                    dVar39 = dVar41;
                  } while (lVar20 != 0x80);
                }
                if (uVar8 >> 0x20 == 0) {
                  pfVar24 = pfVar24 + 1;
                  uVar32 = uVar33 + uVar8;
                  pfVar18 = pfVar18 + (uVar32 >> 0x20);
                  uVar33 = uVar32 & 0xffffffff;
                }
                else {
                  uVar27 = uVar27 + uVar28;
                  pfVar18 = pfVar18 + 1;
                  if (uVar27 >> 0x20 != 0) {
                    pfVar24 = pfVar24 + 1;
                    uVar27 = uVar27 & 0xffffffff;
                  }
                }
              }
            } while ((pfVar4 <= pfVar17) && (pfVar24 < pfVar23 + ((ulong)uVar35 - 2)));
            (r->phase).quad = uVar27;
            (r->inv_phase).quad = uVar33;
            r->last_amp = dVar39;
            iVar34 = (int)((ulong)((long)pfVar24 - (long)pfVar23) >> 2);
            uVar35 = r->write_filled;
LAB_006f6728:
            r->write_filled = uVar35 - iVar34;
          }
          memcpy(__src,__dest,sVar3);
          bVar36 = pfVar18 == pfVar25;
          pfVar25 = pfVar18;
          if (bVar36) goto LAB_006f6c3f;
          break;
        case 4:
          pfVar17 = (float *)((long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148);
          pfVar18 = pfVar25 + iVar34;
          if (iVar14 == 0) {
            if (4 < (int)uVar35) {
              uVar27 = (r->phase).quad;
              uVar33 = (r->phase_inc).quad;
              pfVar23 = pfVar17;
              do {
                if (pfVar18 <= pfVar25) break;
                uVar28 = (long)(int)(uVar27 >> 0x14) & 0xfffffffffffffffc;
                pfVar24 = pfVar25 + 1;
                *pfVar25 = pfVar23[3] * cubic_lut[uVar28 + 3] + pfVar23[1] * cubic_lut[uVar28 + 1] +
                           pfVar23[2] * cubic_lut[uVar28 + 2] + *pfVar23 * cubic_lut[uVar28];
                uVar28 = uVar27 + uVar33;
                pfVar23 = pfVar23 + (uVar28 >> 0x20);
                uVar27 = uVar28 & 0xffffffff;
                pfVar25 = pfVar24;
              } while (pfVar23 < pfVar17 + ((ulong)uVar35 - 4));
              (r->phase).quad = uVar27;
              iVar34 = (int)((ulong)((long)pfVar23 - (long)pfVar17) >> 2);
              goto LAB_006f64f5;
            }
          }
          else if (4 < (int)uVar35) {
            uVar27 = (r->phase).quad;
            uVar33 = (r->phase_inc).quad;
            pfVar23 = pfVar17;
            do {
              if (pfVar18 <= pfVar25) break;
              uVar28 = (long)(int)(uVar27 >> 0x14) & 0xfffffffffffffffc;
              *pfVar25 = pfVar23[3] * cubic_lut[uVar28 + 3] + pfVar23[1] * cubic_lut[uVar28 + 1] +
                         pfVar23[2] * cubic_lut[uVar28 + 2] + *pfVar23 * cubic_lut[uVar28];
              pfVar25 = pfVar25 + 1;
              uVar28 = uVar27 + uVar33;
              pfVar23 = pfVar23 + (uVar28 >> 0x20);
              uVar27 = uVar28 & 0xffffffff;
            } while (pfVar23 < pfVar17 + ((ulong)uVar35 - 4));
            (r->phase).quad = uVar27;
            iVar34 = (int)((ulong)((long)pfVar23 - (long)pfVar17) >> 2);
            uVar35 = r->write_filled;
LAB_006f64f5:
            iVar34 = uVar35 - iVar34;
            goto LAB_006f6c0b;
          }
          break;
        case 5:
          uVar28 = (long)r + (long)(int)uVar35 * -4 + (long)r->write_pos * 4 + 0x148;
          pfVar17 = pfVar25 + iVar34;
          if (iVar14 == 0) {
            if (0x20 < (int)uVar35) {
              uVar8 = (r->phase_inc).quad;
              uVar27 = (r->phase).quad;
              iVar34 = (int)(4.3936485e+12 / (float)uVar8);
              if (uVar8 < 0x100000001) {
                iVar34 = 0x3fe;
              }
              uVar32 = uVar28;
              pfVar18 = pfVar25;
              do {
                iVar21 = (int)(uVar27 >> 0x16);
                iVar15 = iVar34 * iVar21;
                iVar16 = iVar15 + 0x3ff;
                if (-1 < iVar15) {
                  iVar16 = iVar15;
                }
                pfVar25 = pfVar18;
                if (pfVar18 < pfVar17) {
                  uVar30 = (iVar16 >> 10) + iVar34 * -0x10;
                  uVar22 = iVar21 - 0x4000;
                  dVar39 = 0.0;
                  iVar16 = 0x11;
                  pdVar19 = local_40;
                  do {
                    uVar9 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar9 = uVar30;
                    }
                    uVar10 = -uVar22;
                    if (0 < (int)uVar22) {
                      uVar10 = uVar22;
                    }
                    fVar37 = window_lut[uVar10];
                    fVar40 = sinc_lut[uVar9];
                    *pdVar19 = (double)(fVar37 * fVar40);
                    dVar39 = dVar39 + (double)(fVar37 * fVar40);
                    iVar16 = iVar16 + -1;
                    pdVar19 = pdVar19 + -1;
                    uVar22 = uVar22 + 0x400;
                    uVar30 = uVar30 + iVar34;
                  } while (-0xf < iVar16);
                  fVar37 = 0.0;
                  fVar40 = 0.0;
                  lVar20 = 0;
                  do {
                    uVar5 = *(undefined8 *)(uVar32 + lVar20 * 4);
                    fVar37 = fVar37 + (float)((double)(float)uVar5 * (double)(&local_138)[lVar20]);
                    fVar40 = fVar40 + (float)((double)(float)((ulong)uVar5 >> 0x20) *
                                             (double)(&uStack_130)[lVar20]);
                    lVar20 = lVar20 + 2;
                  } while (lVar20 != 0x20);
                  *pfVar18 = (float)((double)(fVar40 + fVar37) / dVar39);
                  uVar32 = uVar32 + (uVar27 + uVar8 >> 0x20) * 4;
                  uVar27 = uVar27 + uVar8 & 0xffffffff;
                  pfVar25 = pfVar18 + 1;
                }
              } while ((pfVar18 < pfVar17) &&
                      (pfVar18 = pfVar25, uVar32 < uVar28 + ((ulong)uVar35 - 0x20) * 4));
              (r->phase).quad = uVar27;
              iVar34 = uVar35 - (int)(uVar32 - uVar28 >> 2);
              goto LAB_006f6c0b;
            }
          }
          else if (0x20 < (int)uVar35) {
            uVar8 = (r->phase_inc).quad;
            uVar32 = (r->phase).quad;
            iVar34 = (int)(4.3936485e+12 / (float)uVar8);
            if (uVar8 < 0x100000001) {
              iVar34 = 0x3fe;
            }
            uVar29 = uVar28;
            pfVar18 = pfVar25;
            do {
              pfVar25 = pfVar18;
              if (pfVar18 < pfVar17) {
                iVar21 = (int)(uVar32 >> 0x16);
                iVar15 = iVar34 * iVar21;
                iVar16 = iVar15 + 0x3ff;
                if (-1 < iVar15) {
                  iVar16 = iVar15;
                }
                uVar30 = (iVar16 >> 10) + iVar34 * -0x10;
                uVar22 = iVar21 - 0x4000;
                fVar37 = 0.0;
                lVar20 = 0x11;
                do {
                  uVar9 = -uVar30;
                  if (0 < (int)uVar30) {
                    uVar9 = uVar30;
                  }
                  uVar10 = -uVar22;
                  if (0 < (int)uVar22) {
                    uVar10 = uVar22;
                  }
                  fVar40 = window_lut[uVar10];
                  fVar42 = sinc_lut[uVar9];
                  afStack_100[lVar20] = fVar40 * fVar42;
                  fVar37 = fVar37 + fVar40 * fVar42;
                  lVar20 = lVar20 + -1;
                  uVar30 = uVar30 + iVar34;
                  uVar22 = uVar22 + 0x400;
                } while (-0xf < lVar20);
                fVar40 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                lVar20 = 0;
                do {
                  pfVar25 = (float *)(uVar29 + lVar20);
                  fVar40 = fVar40 + *pfVar25 * *(float *)((long)&local_138 + lVar20);
                  fVar42 = fVar42 + pfVar25[1] * *(float *)((long)&local_138 + lVar20 + 4);
                  fVar43 = fVar43 + pfVar25[2] * *(float *)((long)&uStack_130 + lVar20);
                  fVar44 = fVar44 + pfVar25[3] * *(float *)((long)&uStack_130 + lVar20 + 4);
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0x80);
                *pfVar18 = (fVar44 + fVar42 + fVar43 + fVar40) / fVar37;
                uVar29 = uVar29 + (uVar32 + uVar8 >> 0x20) * 4;
                uVar32 = uVar32 + uVar8 & 0xffffffff;
                pfVar25 = pfVar18 + 1;
              }
            } while ((pfVar18 < pfVar17) &&
                    (pfVar18 = pfVar25, uVar29 < uVar28 + ((ulong)uVar35 - 0x20) * 4));
            (r->phase).quad = uVar32;
            iVar34 = r->write_filled - (int)(uVar29 - uVar28 >> 2);
            goto LAB_006f6c0b;
          }
        }
      }
      uVar35 = r->write_filled;
      r->read_filled = (r->read_filled - iVar31) + (int)((ulong)((long)pfVar25 - (long)__src) >> 2);
    } while (iVar26 < (int)uVar35);
  }
LAB_006f6c3f:
  if ((r->delay_removed < '\0') && (r->delay_removed = '\0', (r->quality - 1 & 0xfd) == 0)) {
    iVar26 = -0xf;
    do {
      resampler_remove_sample(r,1);
      iVar26 = iVar26 + 1;
    } while (iVar26 != 0);
  }
  return;
}

Assistant:

static void resampler_fill_and_remove_delay(resampler * r)
{
    resampler_fill( r );
    if ( r->delay_removed < 0 )
    {
        int delay = resampler_output_delay( r );
        r->delay_removed = 0;
        while ( delay-- )
            resampler_remove_sample( r, 1 );
    }
}